

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.cpp
# Opt level: O3

bool glcts::PipelineStatisticsQueryTestFunctional2::executeClearBufferfvColorBufferTest(void *pThis)

{
  deUint32 err;
  long lVar1;
  GLfloat clear_color [4];
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  local_28 = 0;
  uStack_24 = 0x3dcccccd;
  uStack_20 = 0x3e4ccccd;
  uStack_1c = 0x3e99999a;
  lVar1 = (**(code **)(**(long **)(*(long *)((long)pThis + 0x70) + 8) + 0x18))();
  (**(code **)(lVar1 + 0x1a8))(0x1800,0,&local_28);
  err = (**(code **)(lVar1 + 0x800))();
  glu::checkError(err,"glClearBufferfv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cPipelineStatisticsQueryTests.cpp"
                  ,0xa0a);
  return true;
}

Assistant:

bool PipelineStatisticsQueryTestFunctional2::executeClearBufferfvColorBufferTest(void* pThis)
{
	const glw::GLfloat						clear_color[4] = { 0, 0.1f, 0.2f, 0.3f };
	PipelineStatisticsQueryTestFunctional2* data_ptr	   = (PipelineStatisticsQueryTestFunctional2*)pThis;
	const glw::Functions&					gl			   = data_ptr->m_context.getRenderContext().getFunctions();

	gl.clearBufferfv(GL_COLOR, 0, /* drawbuffer */
					 clear_color);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferfv() call failed.");

	return true;
}